

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O2

void __thiscall FRandom::GenRandArray(FRandom *this,w128_t *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  QWORD QVar4;
  w128_t *pwVar5;
  ulong uVar6;
  w128_t *c;
  ulong uVar7;
  long lVar8;
  w128_t *pwVar9;
  w128_t *d;
  w128_t *pwVar10;
  QWORD *pQVar11;
  bool bVar12;
  
  pwVar10 = (this->sfmt).w128 + 2;
  lVar8 = 3;
  pwVar9 = array;
  c = (this->sfmt).w128 + 3;
  d = (this->sfmt).w128 + 4;
  while (pwVar5 = pwVar9, bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
    do_recursion(pwVar5,pwVar10 + -2,pwVar10,c,d);
    pwVar10 = pwVar10 + 1;
    pwVar9 = pwVar5 + 1;
    c = d;
    d = pwVar5;
  }
  pwVar10 = (this->sfmt).w128 + 3;
  lVar8 = 2;
  pwVar9 = array;
  while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
    pwVar5 = pwVar9 + 3;
    do_recursion(pwVar5,pwVar10,pwVar9,c,d);
    pwVar10 = pwVar10 + 1;
    pwVar9 = pwVar9 + 1;
    c = d;
    d = pwVar5;
  }
  pwVar10 = array;
  for (lVar8 = 5; lVar8 < size + -5; lVar8 = lVar8 + 1) {
    pwVar9 = pwVar10 + 5;
    do_recursion(pwVar9,pwVar10,pwVar10 + 2,c,d);
    pwVar10 = pwVar10 + 1;
    c = d;
    d = pwVar9;
  }
  uVar7 = 0;
  uVar6 = (ulong)(10U - size);
  if ((int)(10U - size) < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
    puVar1 = (undefined8 *)((long)array + uVar7 + (long)size * 0x10 + -0x50);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&this->sfmt + uVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  pQVar11 = (QWORD *)((long)&this->sfmt + uVar6 * 0x10);
  pwVar10 = pwVar10 + 5;
  for (; lVar8 < size; lVar8 = lVar8 + 1) {
    do_recursion(pwVar10,pwVar10 + -5,pwVar10 + -3,c,d);
    QVar4 = pwVar10->u64[1];
    *pQVar11 = pwVar10->u64[0];
    pQVar11[1] = QVar4;
    pQVar11 = pQVar11 + 2;
    c = d;
    d = pwVar10;
    pwVar10 = pwVar10 + 1;
  }
  return;
}

Assistant:

void FRandom::GenRandArray(w128_t *array, int size)
{
	int i, j;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < size - SFMT::N; i++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (j = 0; j < 2 * SFMT::N - size; j++) {
		sfmt.w128[j] = array[j + size - SFMT::N];
	}
	for (; i < size; i++, j++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
		sfmt.w128[j] = array[i];
	}
}